

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

int __thiscall Fl_Text_Display::handle(Fl_Text_Display *this,int event)

{
  Fl_Text_Buffer *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Fl_Window *pFVar5;
  EVP_PKEY_CTX *pEVar6;
  size_t sVar7;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar8;
  uint *__writefds;
  Fl_Cursor FVar9;
  Fl_Text_Buffer *pFVar10;
  fd_set *in_R8;
  timeval *in_R9;
  undefined8 uStack_40;
  int end;
  int start;
  
  if (this->mBuffer == (Fl_Text_Buffer *)0x0) {
    return 0;
  }
  iVar1 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,
                           (this->text_area).h);
  iVar3 = Fl::e_y;
  iVar2 = Fl::e_x;
  if (iVar1 != 0 || this->dragging != 0) {
    if (0x12 < event - 1U) {
      return 0;
    }
    __writefds = (uint *)((long)&switchD_001d11ce::switchdataD_00214ff8 +
                         (long)(int)(&switchD_001d11ce::switchdataD_00214ff8)[event - 1U]);
    switch(event) {
    case 1:
      iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
      if ((iVar2 != 0) &&
         (pFVar5 = Fl_Widget::window((Fl_Widget *)this), pFVar5 != (Fl_Window *)0x0)) {
        uVar4 = (this->text_area).h;
        __writefds = (uint *)(ulong)uVar4;
        iVar2 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,uVar4);
        pFVar5 = Fl_Widget::window((Fl_Widget *)this);
        FVar9 = FL_CURSOR_INSERT;
        if (iVar2 == 0) {
          FVar9 = FL_CURSOR_DEFAULT;
        }
        Fl_Window::cursor(pFVar5,FVar9);
      }
      if ((Fl_Text_Display *)Fl::focus_ != this) {
        Fl::focus((Fl_Widget *)this);
        (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
      }
      iVar2 = Fl_Group::handle(&this->super_Fl_Group,1);
      if (iVar2 != 0) {
        return 1;
      }
      if ((Fl::e_state._2_1_ & 1) == 0) {
        this->dragging = 1;
        iVar2 = xy_to_position(this,Fl::e_x,Fl::e_y,(int)__writefds);
        this->dragPos = iVar2;
        iVar1 = Fl_Text_Selection::includes(&this->mBuffer->mPrimary,iVar2);
        iVar3 = Fl::e_clicks;
        if (iVar1 == 0) {
          this->dragType = Fl::e_clicks;
          if (iVar3 == 1) {
            pFVar10 = this->mBuffer;
            iVar3 = word_start(this,iVar2);
            uVar4 = word_end(this,iVar2);
            Fl_Text_Buffer::select
                      (pFVar10,iVar3,(fd_set *)(ulong)uVar4,(fd_set *)__writefds,in_R8,in_R9);
            iVar3 = word_start(this,iVar2);
            this->dragPos = iVar3;
          }
          else if (iVar3 == 0) {
            Fl_Text_Buffer::unselect(this->mBuffer);
          }
          if ((this->mBuffer->mPrimary).mSelected == true) {
            iVar2 = (this->mBuffer->mPrimary).mEnd;
          }
          insert_position(this,iVar2);
          show_insert_position(this);
          return 1;
        }
        this->dragType = -1;
        return 1;
      }
      UNRECOVERED_JUMPTABLE = (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3];
      uStack_40 = 5;
      break;
    case 2:
      if ((((Fl::e_is_click != 0) && (Fl::e_clicks == 0)) &&
          (iVar2 = Fl_Text_Selection::includes(&this->mBuffer->mPrimary,this->dragPos), iVar2 != 0))
         && ((Fl::e_state._2_1_ & 1) == 0)) {
        Fl_Text_Buffer::unselect(this->mBuffer);
        insert_position(this,this->dragPos);
        return 1;
      }
      if ((Fl::e_clicks == 2) && (Fl::e_keysym == 0xfee9)) {
        pFVar10 = this->mBuffer;
        iVar2 = Fl_Text_Buffer::line_start(pFVar10,this->dragPos);
        this_00 = this->mBuffer;
        iVar3 = Fl_Text_Buffer::line_end(this_00,this->dragPos);
        uVar4 = Fl_Text_Buffer::next_char(this_00,iVar3);
        Fl_Text_Buffer::select
                  (pFVar10,iVar2,(fd_set *)(ulong)uVar4,(fd_set *)__writefds,in_R8,in_R9);
        iVar2 = line_start(this,this->dragPos);
        this->dragPos = iVar2;
      }
      else {
        this->dragging = 0;
        if (scroll_direction != 0) {
          Fl::remove_timeout(scroll_timer_cb,this);
          scroll_direction = 0;
        }
      }
      this->dragType = 0;
      goto LAB_001d1746;
    case 3:
    case 0xb:
      goto switchD_001d11ce_caseD_3;
    case 4:
    case 0xf:
      goto switchD_001d11ce_caseD_4;
    case 5:
      if (this->dragType == -2) {
        return 1;
      }
      if (this->dragType != -1) {
        iVar1 = this->mCursorPos;
        iVar8 = (this->text_area).y;
        if (Fl::e_y < iVar8) {
          scroll_x = Fl::e_x;
          scroll_amount = (Fl::e_y - iVar8) / 5 + -1;
          if (scroll_direction == 0) {
            Fl::add_timeout(0.01,scroll_timer_cb,this);
          }
          scroll_direction = 3;
        }
        else {
          iVar8 = iVar8 + (this->text_area).h;
          if (Fl::e_y < iVar8) {
            iVar8 = (this->text_area).x;
            if (Fl::e_x < iVar8) {
              scroll_y = Fl::e_y;
              scroll_amount = (Fl::e_x - iVar8) / 2 + -1;
              if (scroll_direction == 0) {
                Fl::add_timeout(0.01,scroll_timer_cb,this);
              }
              scroll_direction = 2;
            }
            else {
              iVar8 = iVar8 + (this->text_area).w;
              if (Fl::e_x < iVar8) {
                if (scroll_direction != 0) {
                  Fl::remove_timeout(scroll_timer_cb,this);
                  scroll_direction = 0;
                }
                iVar2 = xy_to_position(this,iVar2,iVar3,iVar8);
                iVar1 = Fl_Text_Buffer::next_char(this->mBuffer,iVar2);
              }
              else {
                scroll_y = Fl::e_y;
                scroll_amount = (Fl::e_x - iVar8) / 2 + 1;
                if (scroll_direction == 0) {
                  Fl::add_timeout(0.01,scroll_timer_cb,this);
                }
                scroll_direction = 1;
              }
            }
          }
          else {
            scroll_x = Fl::e_x;
            scroll_amount = (Fl::e_y - iVar8) / 5 + 1;
            if (scroll_direction == 0) {
              Fl::add_timeout(0.01,scroll_timer_cb,this);
            }
            scroll_direction = 4;
          }
        }
        fl_text_drag_me(iVar1,this);
        return 1;
      }
      if (Fl::e_is_click != 0) {
        return 1;
      }
      iVar2 = Fl::dnd_text_ops();
      if (iVar2 == 0) {
        return 1;
      }
      pEVar6 = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(this->mBuffer);
      Fl::dnd();
      goto LAB_001d153f;
    case 6:
      goto switchD_001d11ce_caseD_6;
    case 7:
      goto switchD_001d11ce_caseD_7;
    case 8:
      goto switchD_001d11ce_caseD_8;
    default:
      goto switchD_001d11ce_caseD_9;
    case 0xc:
      if (this->shortcut_ == 0) {
        iVar2 = Fl_Widget::test_shortcut((Fl_Widget *)this);
      }
      else {
        iVar2 = Fl::test_shortcut(this->shortcut_);
      }
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = Fl::visible_focus();
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
      if (iVar2 == 0) {
        return 0;
      }
      Fl::focus((Fl_Widget *)this);
      return 1;
    case 0x13:
      if (Fl::e_dy == 0) {
        this = (Fl_Text_Display *)this->mHScrollBar;
      }
      else {
        this = (Fl_Text_Display *)this->mVScrollBar;
      }
      UNRECOVERED_JUMPTABLE = (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3];
      uStack_40 = 0x13;
    }
    iVar2 = (*UNRECOVERED_JUMPTABLE)(this,uStack_40);
    return iVar2;
  }
  __writefds = &switchD_001d12d4::switchdataD_00215044;
  switch(event) {
  case 3:
  case 0xb:
switchD_001d11ce_caseD_3:
    iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,
                             (this->text_area).h);
    pFVar5 = Fl_Widget::window((Fl_Widget *)this);
    if (iVar2 != 0) {
      FVar9 = FL_CURSOR_INSERT;
      goto LAB_001d1347;
    }
    break;
  case 4:
switchD_001d11ce_caseD_4:
    iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar2 == 0) {
      return 0;
    }
    pFVar5 = Fl_Widget::window((Fl_Widget *)this);
    if (pFVar5 == (Fl_Window *)0x0) {
      return 0;
    }
    pFVar5 = Fl_Widget::window((Fl_Widget *)this);
    break;
  default:
    iVar2 = Fl_Group::handle(&this->super_Fl_Group,event);
    return iVar2;
  case 6:
    goto switchD_001d11ce_caseD_6;
  case 7:
switchD_001d11ce_caseD_7:
    iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
    if ((iVar2 != 0) && (pFVar5 = Fl_Widget::window((Fl_Widget *)this), pFVar5 != (Fl_Window *)0x0))
    {
      pFVar5 = Fl_Widget::window((Fl_Widget *)this);
      Fl_Window::cursor(pFVar5,FL_CURSOR_DEFAULT);
    }
    goto switchD_001d11ce_caseD_6;
  case 8:
switchD_001d11ce_caseD_8:
    if ((Fl::e_state._2_1_ & 4) != 0) {
      if (Fl::e_keysym == 0x61) {
        Fl_Text_Buffer::select
                  (this->mBuffer,0,(fd_set *)(ulong)(uint)this->mBuffer->mLength,
                   (fd_set *)__writefds,in_R8,in_R9);
LAB_001d1746:
        pEVar6 = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(this->mBuffer);
        if (*pEVar6 != (EVP_PKEY_CTX)0x0) {
          sVar7 = strlen((char *)pEVar6);
          Fl::copy(pEVar6,(EVP_PKEY_CTX *)(sVar7 & 0xffffffff));
        }
        free(pEVar6);
        return 1;
      }
      if (Fl::e_keysym == 99) {
        if ((this->mBuffer->mPrimary).mSelected == false) {
          return 1;
        }
        pEVar6 = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(this->mBuffer);
        if (*pEVar6 != (EVP_PKEY_CTX)0x0) {
          sVar7 = strlen((char *)pEVar6);
          Fl::copy(pEVar6,(EVP_PKEY_CTX *)(sVar7 & 0xffffffff));
        }
LAB_001d153f:
        free(pEVar6);
        return 1;
      }
    }
    iVar2 = (*(this->mVScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget
              [3])(this->mVScrollBar,8);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = (*(this->mHScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget
              [3])(this->mHScrollBar,8);
    if (iVar2 != 0) {
      return 1;
    }
  case 9:
    goto switchD_001d11ce_caseD_9;
  }
  FVar9 = FL_CURSOR_DEFAULT;
LAB_001d1347:
  Fl_Window::cursor(pFVar5,FVar9);
  return 1;
switchD_001d11ce_caseD_9:
  return 0;
switchD_001d11ce_caseD_6:
  pFVar10 = this->mBuffer;
  if ((pFVar10->mPrimary).mSelected != false) {
    iVar2 = Fl_Text_Buffer::selection_position(pFVar10,&start,&end);
    if (iVar2 != 0) {
      redisplay_range(this,start,end);
    }
    pFVar10 = this->mBuffer;
  }
  if ((pFVar10->mSecondary).mSelected != false) {
    iVar2 = Fl_Text_Buffer::secondary_selection_position(pFVar10,&start,&end);
    if (iVar2 != 0) {
      redisplay_range(this,start,end);
    }
    pFVar10 = this->mBuffer;
  }
  if ((pFVar10->mHighlight).mSelected != false) {
    iVar2 = Fl_Text_Buffer::highlight_position(pFVar10,&start,&end);
    if (iVar2 != 0) {
      redisplay_range(this,start,end);
      return 1;
    }
    return 1;
  }
  return 1;
}

Assistant:

int Fl_Text_Display::handle(int event) {
  if (!buffer()) return 0;
  // This isn't very elegant!
  if (!Fl::event_inside(text_area.x, text_area.y, text_area.w, text_area.h) &&
      !dragging && event != FL_LEAVE && event != FL_ENTER &&
      event != FL_MOVE && event != FL_FOCUS && event != FL_UNFOCUS &&
      event != FL_KEYBOARD && event != FL_KEYUP) {
    return Fl_Group::handle(event);
  }

  switch (event) {
    case FL_ENTER:
    case FL_MOVE:
      if (active_r()) {
        if (Fl::event_inside(text_area.x, text_area.y, text_area.w,
	                     text_area.h)) window()->cursor(FL_CURSOR_INSERT);
	else window()->cursor(FL_CURSOR_DEFAULT);
	return 1;
      } else {
        return 0;
      }

    case FL_LEAVE:
    case FL_HIDE:
      if (active_r() && window()) {
        window()->cursor(FL_CURSOR_DEFAULT);

	return 1;
      } else {
	return 0;
      }

    case FL_PUSH: {
      if (active_r() && window()) {
        if (Fl::event_inside(text_area.x, text_area.y, text_area.w,
                             text_area.h)) window()->cursor(FL_CURSOR_INSERT);
        else window()->cursor(FL_CURSOR_DEFAULT);
      }

      if (Fl::focus() != this) {
        Fl::focus(this);
        handle(FL_FOCUS);
      }
      if (Fl_Group::handle(event)) return 1;
      if (Fl::event_state()&FL_SHIFT) return handle(FL_DRAG);
      dragging = 1;
      int pos = xy_to_position(Fl::event_x(), Fl::event_y(), CURSOR_POS);
      dragPos = pos;
      if (buffer()->primary_selection()->includes(pos)) {
        dragType = DRAG_START_DND;
        return 1;
      }
      dragType = Fl::event_clicks();
      if (dragType == DRAG_CHAR) {
        buffer()->unselect();
//	Fl::copy("", 0, 0); /* removed for STR 2668 */
      }
      else if (dragType == DRAG_WORD) {
        buffer()->select(word_start(pos), word_end(pos));
	dragPos = word_start(pos);
	}

      if (buffer()->primary_selection()->selected())
        insert_position(buffer()->primary_selection()->end());
      else
        insert_position(pos);
      show_insert_position();
      return 1;
    }

    case FL_DRAG: {
      if (dragType==DRAG_NONE)
        return 1;
      if (dragType==DRAG_START_DND) {
        if (!Fl::event_is_click() && Fl::dnd_text_ops()) {
          const char* copy = buffer()->selection_text();
#ifdef __APPLE__
          Fl_X::dnd(1);
#else
          Fl::dnd();
#endif
          free((void*)copy);
        }
        return 1;
      }
      int X = Fl::event_x(), Y = Fl::event_y(), pos = insert_position();
      // if we leave the text_area, we start a timer event
      // that will take care of scrolling and selecting
      if (Y < text_area.y) {
        scroll_x = X;
        scroll_amount = (Y - text_area.y) / 5 - 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 3;
      } else if (Y >= text_area.y+text_area.h) {
        scroll_x = X;
        scroll_amount = (Y - text_area.y - text_area.h) / 5 + 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 4;
      } else if (X < text_area.x) {
        scroll_y = Y;
        scroll_amount = (X - text_area.x) / 2 - 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 2;
      } else if (X >= text_area.x+text_area.w) {
        scroll_y = Y;
        scroll_amount = (X - text_area.x - text_area.w) / 2 + 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 1;
      } else {
        if (scroll_direction) {
          Fl::remove_timeout(scroll_timer_cb, this);
          scroll_direction = 0;
        }
        pos = xy_to_position(X, Y, CURSOR_POS);
        pos = buffer()->next_char(pos);
      }
      fl_text_drag_me(pos, this);
      return 1;
    }

    case FL_RELEASE: {
      if (Fl::event_is_click() && (! Fl::event_clicks()) &&
	  buffer()->primary_selection()->includes(dragPos) && !(Fl::event_state()&FL_SHIFT) ) {
	buffer()->unselect(); // clicking in the selection: unselect and move cursor
	insert_position(dragPos);
	return 1;
      } else if (Fl::event_clicks() == DRAG_LINE && Fl::event_button() == FL_LEFT_MOUSE) {
        buffer()->select(buffer()->line_start(dragPos), buffer()->next_char(buffer()->line_end(dragPos)));
	dragPos = line_start(dragPos);
	dragType = DRAG_CHAR;
      } else {
	dragging = 0;
	if (scroll_direction) {
	  Fl::remove_timeout(scroll_timer_cb, this);
	  scroll_direction = 0;
	}

	// convert from WORD or LINE selection to CHAR
	/*if (insert_position() >= dragPos)
	  dragPos = buffer()->primary_selection()->start();
	else
	  dragPos = buffer()->primary_selection()->end();*/
	dragType = DRAG_CHAR;
      }

      const char* copy = buffer()->selection_text();
      if (*copy) Fl::copy(copy, (int) strlen(copy), 0);
      free((void*)copy);
      return 1;
    }

    case FL_MOUSEWHEEL:
      if (Fl::event_dy()) return mVScrollBar->handle(event);
      else return mHScrollBar->handle(event);

    case FL_UNFOCUS:
      if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    case FL_FOCUS:
      if (buffer()->selected()) {
        int start, end;
        if (buffer()->selection_position(&start, &end))
          redisplay_range(start, end);
      }
      if (buffer()->secondary_selected()) {
        int start, end;
        if (buffer()->secondary_selection_position(&start, &end))
          redisplay_range(start, end);
      }
      if (buffer()->highlight()) {
        int start, end;
        if (buffer()->highlight_position(&start, &end))
          redisplay_range(start, end);
      }
      return 1;

    case FL_KEYBOARD:
      // Copy?
      if ((Fl::event_state()&(FL_CTRL|FL_COMMAND)) && Fl::event_key()=='c') {
        if (!buffer()->selected()) return 1;
        const char *copy = buffer()->selection_text();
        if (*copy) Fl::copy(copy, (int) strlen(copy), 1);
        free((void*)copy);
        return 1;
      }

      // Select all ?
      if ((Fl::event_state()&(FL_CTRL|FL_COMMAND)) && Fl::event_key()=='a') {
        buffer()->select(0,buffer()->length());
        const char *copy = buffer()->selection_text();
        if (*copy) Fl::copy(copy, (int) strlen(copy), 0);
        free((void*)copy);
        return 1;
      }

      if (mVScrollBar->handle(event)) return 1;
      if (mHScrollBar->handle(event)) return 1;

      break;

    case FL_SHORTCUT:
      if (!(shortcut() ? Fl::test_shortcut(shortcut()) : test_shortcut()))
        return 0;
      if (Fl::visible_focus() && handle(FL_FOCUS)) {
        Fl::focus(this);
        return 1;
      }
      break;

  }

  return 0;
}